

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pt_encoder.c
# Opt level: O0

int pt_encoder_init(pt_encoder *encoder,pt_config *config)

{
  int errcode;
  pt_config *config_local;
  pt_encoder *encoder_local;
  
  if (encoder == (pt_encoder *)0x0) {
    encoder_local._4_4_ = -2;
  }
  else {
    memset(encoder,0,0x120);
    encoder_local._4_4_ = pt_config_from_user(&encoder->config,config);
    if (-1 < encoder_local._4_4_) {
      encoder->pos = (encoder->config).begin;
      encoder_local._4_4_ = 0;
    }
  }
  return encoder_local._4_4_;
}

Assistant:

int pt_encoder_init(struct pt_encoder *encoder, const struct pt_config *config)
{
	int errcode;

	if (!encoder)
		return -pte_invalid;

	memset(encoder, 0, sizeof(*encoder));

	errcode = pt_config_from_user(&encoder->config, config);
	if (errcode < 0)
		return errcode;

	encoder->pos = encoder->config.begin;

	return 0;
}